

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O1

void __thiscall Vector::appendValue(Vector *this,long l)

{
  ulong uVar1;
  unsigned_long uVar2;
  long *plVar3;
  ulong uVar4;
  
  uVar1 = this->vaLength;
  if (this->vLength == uVar1) {
    uVar4 = uVar1 >> 3;
    if ((long)(uVar1 >> 3) < vDefaultBoost) {
      uVar4 = vDefaultBoost;
    }
    this->vaLength = uVar4 + uVar1;
    plVar3 = (long *)realloc(this->vData,(uVar4 + uVar1) * 8);
    this->vData = plVar3;
  }
  uVar2 = this->vLength;
  this->vLength = uVar2 + 1;
  this->vData[uVar2] = l;
  return;
}

Assistant:

void Vector::appendValue(const long l) {
  long addThis;
  if (vLength == vaLength) {
    addThis = vaLength / 8;
    if (Vector::vDefaultBoost > addThis)
      addThis = Vector::vDefaultBoost;
    vaLength += addThis;
    vData = (long *)realloc(vData, sizeof(long) * vaLength);
  }
  vData[vLength++] = l;
}